

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgdesll(fitsfile *fptr,int colnum,LONGLONG rownum,LONGLONG *length,LONGLONG *heapaddr,
            int *status)

{
  tcolumn *ptVar1;
  int iVar2;
  tcolumn *colptr;
  LONGLONG descript8 [2];
  uint local_50;
  uint local_4c;
  uint descript4 [2];
  LONGLONG bytepos;
  int *status_local;
  LONGLONG *heapaddr_local;
  LONGLONG *length_local;
  LONGLONG rownum_local;
  int colnum_local;
  fitsfile *fptr_local;
  
  memset(&local_50,0,8);
  memset(&colptr,0,0x10);
  if (*status < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2)) {
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    ptVar1 = fptr->Fptr->tableptr;
    iVar2 = colnum + -1;
    if (ptVar1[iVar2].tdatatype < 0) {
      descript4 = (uint  [2])
                  (fptr->Fptr->datastart + fptr->Fptr->rowlength * (rownum + -1) +
                  ptVar1[iVar2].tbcol);
      if ((ptVar1[iVar2].tform[0] == 'P') || (ptVar1[iVar2].tform[1] == 'P')) {
        iVar2 = ffgi4b(fptr,(LONGLONG)descript4,2,4,(int *)&local_50,status);
        if (iVar2 < 1) {
          if (length != (LONGLONG *)0x0) {
            *length = (ulong)local_50;
          }
          if (heapaddr != (LONGLONG *)0x0) {
            *heapaddr = (ulong)local_4c;
          }
        }
      }
      else {
        iVar2 = ffgi8b(fptr,(LONGLONG)descript4,2,8,(long *)&colptr,status);
        if (iVar2 < 1) {
          if (length != (LONGLONG *)0x0) {
            *length = (LONGLONG)colptr;
          }
          if (heapaddr != (LONGLONG *)0x0) {
            *heapaddr = descript8[0];
          }
        }
      }
      fptr_local._4_4_ = *status;
    }
    else {
      *status = 0x13d;
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgdesll(fitsfile *fptr,   /* I - FITS file pointer                       */
           int colnum,         /* I - column number (1 = 1st column of table) */
           LONGLONG rownum,        /* I - row number (1 = 1st row of table)       */
           LONGLONG *length,   /* O - number of elements in the row           */
           LONGLONG *heapaddr, /* O - heap pointer to the data                */
           int *status)        /* IO - error status                           */
/*
  get (read) the variable length vector descriptor from the binary table.
  This is similar to ffgdes, except it supports the full 8-byte range of the
  length and offset values in 'Q' columns, as well as 'P' columns.
*/
{
    LONGLONG bytepos;
    unsigned int descript4[2] = {0,0};
    LONGLONG descript8[2] = {0,0};
    tcolumn *colptr;

    if (*status > 0)
       return(*status);
       
    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);   /* offset to the correct column */

    if (colptr->tdatatype >= 0) {
        *status = NOT_VARI_LEN;
        return(*status);
    }

    bytepos = (fptr->Fptr)->datastart + 
                  ((fptr->Fptr)->rowlength * (rownum - 1)) +
                   colptr->tbcol;

    if (colptr->tform[0] == 'P' || colptr->tform[1] == 'P')
    {
        /* read 4-byte descriptor */
        if (ffgi4b(fptr, bytepos, 2, 4, (INT32BIT *) descript4, status) <= 0) 
        {
           if (length)
             *length = (LONGLONG) descript4[0];   /* 1st word is the length  */
           if (heapaddr)
             *heapaddr = (LONGLONG) descript4[1]; /* 2nd word is the address */
        }

    }
    else  /* this is for 'Q' columns */
    {
        /* read 8 byte descriptor */
        if (ffgi8b(fptr, bytepos, 2, 8, (long *) descript8, status) <= 0) 
        {
           if (length)
             *length = descript8[0];   /* 1st word is the length  */
           if (heapaddr)
             *heapaddr = descript8[1]; /* 2nd word is the address */
        }
    }     

    return(*status);
}